

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

void remove_option(mtree_option **global,char *value,size_t len)

{
  char cVar1;
  char *__s1;
  mtree_option *pmVar2;
  int iVar3;
  mtree_option *__ptr;
  mtree_option *pmVar4;
  
  if (*global != (mtree_option *)0x0) {
    pmVar2 = *global;
    pmVar4 = (mtree_option *)0x0;
    do {
      __ptr = pmVar2;
      __s1 = __ptr->value;
      iVar3 = strncmp(__s1,value,len);
      if ((iVar3 == 0) && ((cVar1 = __s1[len], cVar1 == '\0' || (cVar1 == '=')))) {
        if (pmVar4 != (mtree_option *)0x0) {
          global = &pmVar4->next;
        }
        ((mtree_option *)global)->next = __ptr->next;
        free(__ptr->value);
        free(__ptr);
        return;
      }
      pmVar2 = __ptr->next;
      pmVar4 = __ptr;
    } while (__ptr->next != (mtree_option *)0x0);
  }
  return;
}

Assistant:

static void
remove_option(struct mtree_option **global, const char *value, size_t len)
{
	struct mtree_option *iter, *last;

	last = NULL;
	for (iter = *global; iter != NULL; last = iter, iter = iter->next) {
		if (strncmp(iter->value, value, len) == 0 &&
		    (iter->value[len] == '\0' ||
		     iter->value[len] == '='))
			break;
	}
	if (iter == NULL)
		return;
	if (last == NULL)
		*global = iter->next;
	else
		last->next = iter->next;

	free(iter->value);
	free(iter);
}